

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void lj_err_argtype(lua_State *L,int narg,char *xname)

{
  int iVar1;
  ulong uVar2;
  undefined8 in_RDX;
  int in_ESI;
  lua_State *in_RDI;
  TValue *o;
  int idx;
  GCfunc *fn;
  char *msg;
  char *tname;
  char *in_stack_ffffffffffffffa0;
  uint local_58;
  uint in_stack_ffffffffffffffac;
  TValue *in_stack_ffffffffffffffb0;
  uint local_48;
  uint local_44;
  char *local_20;
  
  local_58 = in_stack_ffffffffffffffac;
  if (in_ESI < -9999) {
    if (in_ESI < -0x2712) {
      uVar2 = (ulong)in_RDI->base[-1].u32.lo;
      iVar1 = -in_ESI;
      if ((int)(uint)*(byte *)(uVar2 + 7) < iVar1 + -0x2712) {
        local_20 = "no value";
      }
      else {
        if (*(uint *)(uVar2 + 0x24 + (long)(iVar1 + -0x2713) * 8) < 0xffff0000) {
          local_44 = 0xd;
        }
        else {
          if (*(int *)(uVar2 + 0x24 + (long)(iVar1 + -0x2713) * 8) >> 0xf == -2) {
            local_48 = 3;
          }
          else {
            local_48 = *(uint *)(uVar2 + 0x24 + (long)(iVar1 + -0x2713) * 8) ^ 0xffffffff;
          }
          local_44 = local_48;
        }
        local_20 = lj_obj_itypename[local_44];
      }
    }
    else {
      local_20 = "table";
    }
  }
  else {
    if (in_ESI < 0) {
      in_stack_ffffffffffffffb0 = in_RDI->top + in_ESI;
    }
    else {
      in_stack_ffffffffffffffb0 = in_RDI->base + (long)in_ESI + -1;
    }
    if (in_stack_ffffffffffffffb0 < in_RDI->top) {
      if ((in_stack_ffffffffffffffb0->field_2).it < 0xffff0000) {
        local_58 = 0xd;
      }
      else if ((int)(in_stack_ffffffffffffffb0->field_2).it >> 0xf == -2) {
        local_58 = 3;
      }
      else {
        local_58 = (in_stack_ffffffffffffffb0->field_2).it ^ 0xffffffff;
      }
      in_stack_ffffffffffffffa0 = lj_obj_itypename[local_58];
      local_20 = in_stack_ffffffffffffffa0;
    }
    else {
      in_stack_ffffffffffffffa0 = "no value";
      local_20 = in_stack_ffffffffffffffa0;
    }
  }
  lj_strfmt_pushf(in_RDI,lj_err_allmsg + 0x205,in_RDX,local_20);
  err_argmsg((lua_State *)&in_stack_ffffffffffffffb0->field_2,local_58,in_stack_ffffffffffffffa0);
}

Assistant:

LJ_NOINLINE void lj_err_argtype(lua_State *L, int narg, const char *xname)
{
  const char *tname, *msg;
  if (narg <= LUA_REGISTRYINDEX) {
    if (narg >= LUA_GLOBALSINDEX) {
      tname = lj_obj_itypename[~LJ_TTAB];
    } else {
      GCfunc *fn = curr_func(L);
      int idx = LUA_GLOBALSINDEX - narg;
      if (idx <= fn->c.nupvalues)
	tname = lj_typename(&fn->c.upvalue[idx-1]);
      else
	tname = lj_obj_typename[0];
    }
  } else {
    TValue *o = narg < 0 ? L->top + narg : L->base + narg-1;
    tname = o < L->top ? lj_typename(o) : lj_obj_typename[0];
  }
  msg = lj_strfmt_pushf(L, err2msg(LJ_ERR_BADTYPE), xname, tname);
  err_argmsg(L, narg, msg);
}